

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

Int32 testing::internal::Int32FromEnvOrDie(char *var,Int32 default_val)

{
  bool bVar1;
  char *pcVar2;
  Int32 in_ESI;
  Int32 result;
  char *str_val;
  char *in_stack_00000060;
  Message *in_stack_00000068;
  char (*in_stack_ffffffffffffffa8) [35];
  Message *this;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_ffffffffffffffd0;
  Int32 local_24;
  Int32 local_4;
  
  pcVar2 = posix::GetEnv((char *)0x1548c7);
  local_4 = in_ESI;
  if (pcVar2 != (char *)0x0) {
    this = (Message *)&stack0xffffffffffffffd0;
    Message::Message((Message *)in_stack_ffffffffffffffd0.ptr_);
    Message::operator<<(this,in_stack_ffffffffffffffa8);
    Message::operator<<(this,(char **)in_stack_ffffffffffffffa8);
    bVar1 = ParseInt32(in_stack_00000068,in_stack_00000060,(Int32 *)var);
    Message::~Message((Message *)0x15494c);
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      exit(1);
    }
    local_4 = local_24;
  }
  return local_4;
}

Assistant:

Int32 Int32FromEnvOrDie(const char* var, Int32 default_val) {
  const char* str_val = posix::GetEnv(var);
  if (str_val == NULL) {
    return default_val;
  }

  Int32 result;
  if (!ParseInt32(Message() << "The value of environment variable " << var,
                  str_val, &result)) {
    exit(EXIT_FAILURE);
  }
  return result;
}